

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessCoordCase::iterate(TessCoordCase *this)

{
  _anonymous_namespace_ *innerSrc;
  ostringstream *this_00;
  SpacingMode SVar1;
  pointer log;
  RenderContext *pRVar2;
  pointer pvVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _anonymous_namespace_ *p_Var8;
  _anonymous_namespace_ *__dest;
  pointer pVVar9;
  pointer pvVar10;
  Surface *pSVar11;
  _anonymous_namespace_ *p_Var12;
  pointer pvVar13;
  void *__buf;
  void *__buf_00;
  char *description;
  uint uVar14;
  ulong uVar15;
  size_type __n;
  bool bVar16;
  uint uVar17;
  ulong uVar18;
  TessPrimitiveType TVar19;
  ulong uVar20;
  ulong uVar21;
  int j;
  long lVar22;
  size_t __n_00;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *coords;
  ulong uVar23;
  long lVar24;
  bool bVar25;
  float fVar26;
  _anonymous_namespace_ *local_538;
  _anonymous_namespace_ *local_528;
  long local_518;
  string local_508;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 local_4e0;
  undefined4 local_4dc;
  undefined4 local_4d8;
  undefined4 local_4d4;
  int local_4d0;
  int local_4cc;
  string local_4c8;
  long local_4a8;
  size_type local_4a0;
  Result tfResult;
  RandomViewport viewport;
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  caseReferences;
  Surface resVisual;
  Surface refVisual;
  undefined1 local_418 [8];
  undefined1 auStack_410 [8];
  undefined8 local_408;
  long *local_3f8;
  long local_3e8 [9];
  ios_base local_3a0 [264];
  int inner;
  int iStack_294;
  char *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  int outer [3];
  int iStack_1fc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [6];
  ios_base local_190 [272];
  TFHandler tfHandler;
  
  log = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar2 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*pRVar2->_vptr_RenderContext[4])(pRVar2);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  uVar20 = (ulong)dVar7;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar6),0x10,0x10,dVar7);
  dVar7 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar6 = (*pRVar2->_vptr_RenderContext[3])(pRVar2);
  lVar24 = CONCAT44(extraout_var_00,iVar6);
  local_4a8 = lVar24;
  local_4d4 = (**(code **)(lVar24 + 0xb48))(dVar7,"u_tessLevelInner0");
  local_4d8 = (**(code **)(lVar24 + 0xb48))(dVar7,"u_tessLevelInner1");
  local_4dc = (**(code **)(lVar24 + 0xb48))(dVar7,"u_tessLevelOuter0");
  local_4e0 = (**(code **)(lVar24 + 0xb48))(dVar7,"u_tessLevelOuter1");
  local_4e4 = (**(code **)(lVar24 + 0xb48))(dVar7,"u_tessLevelOuter2");
  local_4e8 = (**(code **)(lVar24 + 0xb48))(dVar7,"u_tessLevelOuter3");
  if (this->m_spacing == SPACINGMODE_EQUAL) {
    __dest = (_anonymous_namespace_ *)operator_new(0xd8);
    p_Var8 = __dest + 0xd8;
    memcpy(__dest,Functional::(anonymous_namespace)::TessCoordCase::genTessLevelCases()::
                  rawTessLevelCases,0xd8);
    local_528 = p_Var8;
  }
  else {
    p_Var8 = (_anonymous_namespace_ *)operator_new(0xd8);
    local_528 = p_Var8 + 0xd8;
    lVar24 = 0;
    p_Var12 = p_Var8;
    do {
      local_408 = *(pointer *)
                   (Functional::(anonymous_namespace)::TessCoordCase::genTessLevelCases()::
                    rawTessLevelCases + lVar24 * 0x18 + 0x10);
      local_418 = (undefined1  [8])
                  *(pointer *)
                   (Functional::(anonymous_namespace)::TessCoordCase::genTessLevelCases()::
                    rawTessLevelCases + lVar24 * 0x18);
      auStack_410 = (undefined1  [8])
                    *(pointer *)
                     (Functional::(anonymous_namespace)::TessCoordCase::genTessLevelCases()::
                      rawTessLevelCases + lVar24 * 0x18 + 8);
      SVar1 = this->m_spacing;
      lVar22 = 0;
      do {
        iVar6 = getClampedRoundedTessLevel(SVar1,*(float *)(local_418 + lVar22 * 4));
        *(float *)(local_418 + lVar22 * 4) = (float)iVar6;
        lVar22 = lVar22 + 1;
      } while (lVar22 == 1);
      lVar22 = 2;
      do {
        iVar6 = getClampedRoundedTessLevel(SVar1,*(float *)(local_418 + lVar22 * 4));
        *(float *)(local_418 + lVar22 * 4) = (float)iVar6;
        lVar22 = lVar22 + 1;
      } while (lVar22 != 6);
      if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        if ((((1.0 < (float)auStack_410._0_4_) || (1.0 < (float)auStack_410._4_4_)) ||
            (1.0 < (float)local_408)) &&
           (((float)local_418._0_4_ == 1.0 && (!NAN((float)local_418._0_4_))))) {
          iVar6 = getClampedRoundedTessLevel(SVar1,(float)local_418._0_4_ + 0.1);
          local_418._0_4_ = (float)iVar6;
        }
      }
      else if ((this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) &&
              (((1.0 < (float)auStack_410._0_4_ || (1.0 < (float)auStack_410._4_4_)) ||
               ((1.0 < (float)local_408 || (1.0 < local_408._4_4_)))))) {
        if (((float)local_418._0_4_ == 1.0) && (!NAN((float)local_418._0_4_))) {
          iVar6 = getClampedRoundedTessLevel(SVar1,(float)local_418._0_4_ + 0.1);
          local_418._0_4_ = (float)iVar6;
        }
        if (((float)local_418._4_4_ == 1.0) && (!NAN((float)local_418._4_4_))) {
          iVar6 = getClampedRoundedTessLevel(SVar1,(float)local_418._4_4_ + 0.1);
          local_418._4_4_ = (float)iVar6;
        }
      }
      if (p_Var8 == local_528) {
        __n_00 = (long)p_Var8 - (long)p_Var12;
        if (__n_00 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar18 = ((long)__n_00 >> 3) * -0x5555555555555555;
        uVar23 = uVar18;
        if (p_Var8 == p_Var12) {
          uVar23 = 1;
        }
        uVar15 = uVar23 + uVar18;
        if (0x555555555555554 < uVar15) {
          uVar15 = 0x555555555555555;
        }
        if (CARRY8(uVar23,uVar18)) {
          uVar15 = 0x555555555555555;
        }
        if (uVar15 == 0) {
          __dest = (_anonymous_namespace_ *)0x0;
        }
        else {
          __dest = (_anonymous_namespace_ *)operator_new(uVar15 * 0x18);
        }
        *(pointer *)(__dest + __n_00 + 0x10) = local_408;
        *(undefined1 (*) [8])(__dest + __n_00) = local_418;
        *(undefined1 (*) [8])(__dest + __n_00 + 8) = auStack_410;
        if (0 < (long)__n_00) {
          memmove(__dest,p_Var12,__n_00);
        }
        if (p_Var12 != (_anonymous_namespace_ *)0x0) {
          operator_delete(p_Var12,(long)local_528 - (long)p_Var12);
        }
        p_Var8 = __dest + __n_00;
        local_528 = __dest + uVar15 * 0x18;
      }
      else {
        *(pointer *)(p_Var8 + 0x10) = local_408;
        *(undefined1 (*) [8])p_Var8 = local_418;
        *(undefined1 (*) [8])(p_Var8 + 8) = auStack_410;
        __dest = p_Var12;
      }
      p_Var8 = p_Var8 + 0x18;
      lVar24 = lVar24 + 1;
      p_Var12 = __dest;
    } while (lVar24 != 9);
  }
  __n = ((long)p_Var8 - (long)__dest >> 3) * -0x5555555555555555;
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::vector(&caseReferences,__n,(allocator_type *)local_418);
  uVar14 = (uint)__n;
  if (0 < (int)uVar14) {
    p_Var8 = __dest + 0xc;
    uVar23 = 0;
    do {
      TVar19 = this->m_primitiveType;
      bVar4 = true;
      if (TVar19 == TESSPRIMITIVETYPE_TRIANGLES) {
        uVar17 = 3;
      }
      else if (TVar19 == TESSPRIMITIVETYPE_ISOLINES) {
        uVar17 = 2;
      }
      else if (TVar19 == TESSPRIMITIVETYPE_QUADS) {
        uVar17 = 4;
      }
      else {
        uVar17 = 0xffffffff;
        bVar4 = false;
      }
      p_Var12 = __dest + uVar23 * 0x18 + 8;
      if (bVar4) {
        uVar18 = 1;
        if (1 < (int)uVar17) {
          uVar18 = (ulong)uVar17;
        }
        if (0.0 < *(float *)p_Var12) {
          uVar15 = 0;
          do {
            uVar20 = uVar15;
            uVar21 = uVar18;
            if (uVar18 - 1 == uVar15) break;
            uVar20 = uVar15 + 1;
            lVar24 = uVar15 * 4;
            uVar15 = uVar20;
            uVar21 = uVar20;
          } while (0.0 < *(float *)(p_Var8 + lVar24));
          bVar4 = (long)uVar21 < (long)(int)uVar17;
        }
      }
      if (bVar4) {
        local_418 = (undefined1  [8])0x0;
        auStack_410 = (undefined1  [8])0x0;
        local_408 = (pointer)0x0;
      }
      else {
        SVar1 = this->m_spacing;
        innerSrc = __dest + uVar23 * 0x18;
        if (TVar19 == TESSPRIMITIVETYPE_ISOLINES) {
          fVar26 = 1.0;
          if (1.0 <= *(float *)(innerSrc + 8)) {
            fVar26 = *(float *)(innerSrc + 8);
          }
          fVar26 = ceilf(fVar26);
          iVar6 = getClampedRoundedTessLevel(SVar1,*(float *)(innerSrc + 0xc));
          generateReferenceIsolineTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_418,(int)fVar26,iVar6);
        }
        else if (TVar19 == TESSPRIMITIVETYPE_QUADS) {
          getClampedRoundedQuadTessLevels(SVar1,(float *)innerSrc,(float *)p_Var12,&inner,outer);
          uVar20 = outer._0_8_ & 0xffffffff;
          generateReferenceQuadTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_418,SVar1,inner,iStack_294,outer[0],outer[1],(int)stack0xfffffffffffffe00
                     ,iStack_1fc);
        }
        else if (TVar19 == TESSPRIMITIVETYPE_TRIANGLES) {
          getClampedRoundedTriangleTessLevels(SVar1,(float *)innerSrc,(float *)p_Var12,&inner,outer)
          ;
          uVar20 = (ulong)(uint)outer[1];
          generateReferenceTriangleTessCoords
                    ((vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
                     local_418,SVar1,inner,outer[0],outer[1],outer[2]);
        }
        else {
          local_418 = (undefined1  [8])0x0;
          auStack_410 = (undefined1  [8])0x0;
          local_408 = (pointer)0x0;
        }
      }
      std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::_M_move_assign
                (caseReferences.
                 super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar23,local_418);
      if (local_418 != (undefined1  [8])0x0) {
        operator_delete((void *)local_418,(long)local_408 - (long)local_418);
      }
      uVar23 = uVar23 + 1;
      p_Var8 = p_Var8 + 0x18;
    } while (uVar23 != (uVar14 & 0x7fffffff));
  }
  lVar24 = local_4a8;
  pvVar10 = caseReferences.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1;
  pvVar13 = caseReferences.
            super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (pvVar10 !=
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish &&
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      caseReferences.
      super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      uVar20 = (long)(pvVar10->
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar10->
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      pvVar3 = pvVar10;
      if (uVar20 <= (ulong)((long)(pvVar13->
                                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(pvVar13->
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)) {
        pvVar3 = pvVar13;
      }
      pvVar13 = pvVar3;
      pvVar10 = pvVar10 + 1;
    } while (pvVar10 !=
             caseReferences.
             super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  TransformFeedbackHandler<tcu::Vector<float,_3>_>::TransformFeedbackHandler
            (&tfHandler,((this->super_TestCase).m_context)->m_renderCtx,
             (int)((ulong)((long)(pvVar13->
                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pvVar13->
                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555);
  (**(code **)(lVar24 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar24 + 0x1680))(dVar7);
  (**(code **)(lVar24 + 0xfd8))(0x8e72,1);
  if (0 < (int)uVar14) {
    local_518 = 0;
    local_538 = __dest;
    do {
      TVar19 = (TessPrimitiveType)uVar20;
      local_418 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_410,"Tessellation levels: ",0x15);
      Functional::(anonymous_namespace)::tessellationLevelsString_abi_cxx11_
                ((string *)outer,local_538,(float *)(local_538 + 8),
                 (float *)(ulong)this->m_primitiveType,TVar19);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)auStack_410,(char *)outer._0_8_,(long)stack0xfffffffffffffe00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1f8) {
        operator_delete((void *)outer._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_410);
      std::ios_base::~ios_base(local_3a0);
      lVar24 = local_4a8;
      (**(code **)(local_4a8 + 0x14e0))(*(undefined4 *)local_538,local_4d4);
      (**(code **)(lVar24 + 0x14e0))(*(undefined4 *)(local_538 + 4),local_4d8);
      (**(code **)(lVar24 + 0x14e0))(*(float *)(local_538 + 8),local_4dc);
      (**(code **)(lVar24 + 0x14e0))(*(undefined4 *)(local_538 + 0xc),local_4e0);
      (**(code **)(lVar24 + 0x14e0))(*(undefined4 *)(local_538 + 0x10),local_4e4);
      (**(code **)(lVar24 + 0x14e0))(*(undefined4 *)(local_538 + 0x14),local_4e8);
      err = (**(code **)(lVar24 + 0x800))();
      glu::checkError(err,"Setup failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                      ,0x81e);
      pvVar10 = caseReferences.
                super__Vector_base<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      TransformFeedbackHandler<tcu::Vector<float,_3>_>::renderAndGetPrimitives
                (&tfResult,&tfHandler,dVar7,0,0,(VertexArrayBinding *)0x0,1);
      iVar6 = tfResult.numPrimitives;
      local_4cc = (int)((ulong)(*(long *)((long)&(pvVar10->
                                                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish +
                                         local_518) -
                               *(long *)((long)&(pvVar10->
                                                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                        local_518)) >> 2) * -0x55555555;
      if (tfResult.numPrimitives == local_4cc) {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410,
                   "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ",0x41);
        std::ostream::operator<<((ostringstream *)auStack_410,tfResult.numPrimitives);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410,
                   "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be ",0x44);
        std::ostream::operator<<((ostringstream *)auStack_410,tfResult.numPrimitives);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410,", reference value is ",0x15);
        std::ostream::_M_insert<unsigned_long>((ulong)auStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410," (logging further info anyway)",0x1e);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_410);
      std::ios_base::~ios_base(local_3a0);
      if (this->m_primitiveType - TESSPRIMITIVETYPE_QUADS < 2) {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410,
                   "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_01421e21:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_410);
        std::ios_base::~ios_base(local_3a0);
      }
      else if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        local_418 = (undefined1  [8])log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410,
                   "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively"
                   ,0x78);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_01421e21;
      }
      TVar19 = this->m_primitiveType;
      tcu::Surface::Surface(&refVisual);
      local_4d0 = iVar6;
      tcu::Surface::Surface(&resVisual);
      coords = (vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *)
               ((long)&(pvVar10->
                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_518);
      drawTessCoordVisualization(&refVisual,TVar19,coords);
      drawTessCoordVisualization(&resVisual,TVar19,&tfResult.varying);
      local_418._0_4_ = 0xffff0000;
      bVar4 = oneWayComparePointSets
                        ((TestLog *)log,&refVisual,TVar19,coords,&tfResult.varying,"reference",
                         "result",(RGBA *)local_418);
      local_418._0_4_ = 0xff0000ff;
      bVar5 = oneWayComparePointSets
                        ((TestLog *)log,&resVisual,TVar19,&tfResult.varying,coords,"result",
                         "reference",(RGBA *)local_418);
      this_00 = (ostringstream *)(outer + 2);
      if (!bVar4 || !bVar5) {
        outer._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "Note: in the following reference visualization, points that are missing in result point set are blue (if any)"
                   ,0x6d);
        pVVar9 = (pointer)tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)outer,
                                     (EndMessageToken *)&tcu::TestLog::EndMessage);
        local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
        local_4c8._M_dataplus._M_p = (pointer)0x19;
        local_508._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_4c8);
        local_508.field_2._M_allocated_capacity = (size_type)local_4c8._M_dataplus._M_p;
        builtin_strncpy(local_508._M_dataplus._M_p,"RefTessCoordVisualization",0x19);
        local_508._M_string_length = (size_type)local_4c8._M_dataplus._M_p;
        local_508._M_dataplus._M_p[(long)local_4c8._M_dataplus._M_p] = '\0';
        local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
        local_4a0 = 0x21;
        local_4c8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_4c8,(ulong)&local_4a0);
        local_4c8.field_2._M_allocated_capacity = local_4a0;
        builtin_strncpy(local_4c8._M_dataplus._M_p,"Reference tessCoord visualization",0x21);
        local_4c8._M_string_length = local_4a0;
        local_4c8._M_dataplus._M_p[local_4a0] = '\0';
        pSVar11 = &refVisual;
        tcu::LogImage::LogImage
                  ((LogImage *)&inner,&local_508,&local_4c8,pSVar11,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)&inner,(int)pVVar9,__buf,(size_t)pSVar11);
        local_418 = (undefined1  [8])pVVar9;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_410,
                   "Note: in the following result visualization, points that are missing in reference point set are red (if any)"
                   ,0x6c);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_410);
        std::ios_base::~ios_base(local_3a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_p != local_268) {
          operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_inner != &local_288) {
          operator_delete(_inner,(ulong)(local_288._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
          operator_delete(local_4c8._M_dataplus._M_p,local_4c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_190);
      }
      _inner = (pointer)0x19;
      outer._0_8_ = local_1f8;
      outer._0_8_ = std::__cxx11::string::_M_create((ulong *)outer,(ulong)&inner);
      local_1f8[0]._M_allocated_capacity = _inner;
      builtin_strncpy((char *)outer._0_8_,"ResTessCoordVisualization",0x19);
      stack0xfffffffffffffe00 = (_func_int **)_inner;
      *(char *)(outer._0_8_ + (long)_inner) = '\0';
      _inner = (pointer)&local_288;
      local_508._M_dataplus._M_p = (char *)0x1e;
      _inner = (pointer)std::__cxx11::string::_M_create((ulong *)&inner,(ulong)&local_508);
      local_288._M_allocated_capacity = (size_type)local_508._M_dataplus._M_p;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x10) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x11) = 'v';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x12) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x13) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x14) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x15) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x16) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x17) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x18) = 'z';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x19) = 'a';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1a) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1b) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1c) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0x1d) = 'n';
      *(undefined8 *)_inner = 0x7420746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 8) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 9) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 10) = 's';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xb) = 'C';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xc) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xd) = 'o';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xe) = 'r';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_inner + 0xf) = 'd';
      local_290 = local_508._M_dataplus._M_p;
      _inner[(long)local_508._M_dataplus._M_p] = '\0';
      pSVar11 = &resVisual;
      uVar20 = 2;
      tcu::LogImage::LogImage
                ((LogImage *)local_418,(string *)outer,(string *)&inner,pSVar11,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_418,(int)log,__buf_00,(size_t)pSVar11);
      iVar6 = local_4d0;
      if (local_3f8 != local_3e8) {
        operator_delete(local_3f8,local_3e8[0] + 1);
      }
      if (local_418 != (undefined1  [8])&local_408) {
        operator_delete((void *)local_418,(ulong)((long)local_408->m_data + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_inner != &local_288) {
        operator_delete(_inner,(ulong)(local_288._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)outer._0_8_ != local_1f8) {
        operator_delete((void *)outer._0_8_,local_1f8[0]._M_allocated_capacity + 1);
      }
      bVar25 = iVar6 == local_4cc;
      tcu::Surface::~Surface(&resVisual);
      tcu::Surface::~Surface(&refVisual);
      if (tfResult.varying.
          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(tfResult.varying.
                        super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)tfResult.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)tfResult.varying.
                              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar16 = bVar25 && (bVar4 && bVar5);
      if (!bVar25 || (!bVar4 || !bVar5)) goto LAB_014223da;
      local_418 = (undefined1  [8])log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_410);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_410,"All OK",6);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_418,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_410);
      std::ios_base::~ios_base(local_3a0);
      local_538 = local_538 + 0x18;
      local_518 = local_518 + 0x18;
      uVar14 = (int)__n - 1;
      __n = (size_type)uVar14;
    } while (uVar14 != 0);
  }
  bVar16 = true;
LAB_014223da:
  description = "Invalid tessellation coordinates";
  if (bVar16 != false) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar16 ^ 1),
             description);
  glu::ObjectWrapper::~ObjectWrapper(&tfHandler.m_tfPrimQuery.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&tfHandler.m_tfBuffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&tfHandler.m_tf.super_ObjectWrapper);
  std::
  vector<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>,_std::allocator<std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>_>
  ::~vector(&caseReferences);
  if (__dest != (_anonymous_namespace_ *)0x0) {
    operator_delete(__dest,(long)local_528 - (long)__dest);
  }
  return STOP;
}

Assistant:

TessCoordCase::IterateResult TessCoordCase::iterate (void)
{
	typedef TransformFeedbackHandler<Vec3> TFHandler;

	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();

	const int						tessLevelInner0Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner0");
	const int						tessLevelInner1Loc			= gl.getUniformLocation(programGL, "u_tessLevelInner1");
	const int						tessLevelOuter0Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter0");
	const int						tessLevelOuter1Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter1");
	const int						tessLevelOuter2Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter2");
	const int						tessLevelOuter3Loc			= gl.getUniformLocation(programGL, "u_tessLevelOuter3");

	const vector<TessLevels>		tessLevelCases				= genTessLevelCases();
	vector<vector<Vec3> >			caseReferences				(tessLevelCases.size());

	for (int i = 0; i < (int)tessLevelCases.size(); i++)
		caseReferences[i] = generateReferenceTessCoords(m_primitiveType, m_spacing, &tessLevelCases[i].inner[0], &tessLevelCases[i].outer[0]);

	const int						maxNumVertices				= (int)std::max_element(caseReferences.begin(), caseReferences.end(), SizeLessThan<vector<Vec3> >())->size();
	const TFHandler					tfHandler					(m_context.getRenderContext(), maxNumVertices);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	for (int tessLevelCaseNdx = 0; tessLevelCaseNdx < (int)tessLevelCases.size(); tessLevelCaseNdx++)
	{
		const float* const innerLevels = &tessLevelCases[tessLevelCaseNdx].inner[0];
		const float* const outerLevels = &tessLevelCases[tessLevelCaseNdx].outer[0];

		log << TestLog::Message << "Tessellation levels: " << tessellationLevelsString(innerLevels, outerLevels, m_primitiveType) << TestLog::EndMessage;

		gl.uniform1f(tessLevelInner0Loc, innerLevels[0]);
		gl.uniform1f(tessLevelInner1Loc, innerLevels[1]);
		gl.uniform1f(tessLevelOuter0Loc, outerLevels[0]);
		gl.uniform1f(tessLevelOuter1Loc, outerLevels[1]);
		gl.uniform1f(tessLevelOuter2Loc, outerLevels[2]);
		gl.uniform1f(tessLevelOuter3Loc, outerLevels[3]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Setup failed");

		{
			const vector<Vec3>&			tessCoordsRef	= caseReferences[tessLevelCaseNdx];
			const TFHandler::Result		tfResult		= tfHandler.renderAndGetPrimitives(programGL, GL_POINTS, 0, DE_NULL, 1);

			if (tfResult.numPrimitives != (int)tessCoordsRef.size())
			{
				log << TestLog::Message << "Failure: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be "
										<< tfResult.numPrimitives << ", reference value is " << tessCoordsRef.size()
										<< " (logging further info anyway)" << TestLog::EndMessage;
				success = false;
			}
			else
				log << TestLog::Message << "Note: GL reported GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN to be " << tfResult.numPrimitives << TestLog::EndMessage;

			if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
				log << TestLog::Message << "Note: in the following visualization(s), the u=1, v=1, w=1 corners are at the right, top, and left corners, respectively" << TestLog::EndMessage;
			else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS || m_primitiveType == TESSPRIMITIVETYPE_ISOLINES)
				log << TestLog::Message << "Note: in the following visualization(s), u and v coordinate go left-to-right and bottom-to-top, respectively" << TestLog::EndMessage;
			else
				DE_ASSERT(false);

			success = compareTessCoords(log, m_primitiveType, tessCoordsRef, tfResult.varying) && success;
		}

		if (!success)
			break;
		else
			log << TestLog::Message << "All OK" << TestLog::EndMessage;
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Invalid tessellation coordinates");
	return STOP;
}